

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O1

void __thiscall
duckdb::vector<duckdb::PageInformation,_true>::erase_at
          (vector<duckdb::PageInformation,_true> *this,idx_t idx)

{
  pointer *ppPVar1;
  pointer pPVar2;
  pointer pPVar3;
  InternalException *this_00;
  pointer __src;
  string local_50;
  
  pPVar2 = (this->super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>).
           super__Vector_base<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pPVar3 = (this->super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>).
           super__Vector_base<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (idx <= (ulong)(((long)pPVar3 - (long)pPVar2 >> 3) * -0x3333333333333333)) {
    __src = pPVar2 + idx + 1;
    if (__src != pPVar3) {
      memmove(pPVar2 + idx,__src,(long)pPVar3 - (long)__src);
    }
    ppPVar1 = &(this->
               super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>).
               super__Vector_base<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + -1;
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Can\'t remove offset %d from vector of size %d","");
  InternalException::InternalException<unsigned_long,unsigned_long>
            (this_00,&local_50,idx,
             ((long)(this->
                    super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>)
                    .
                    super__Vector_base<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->
                    super_vector<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>)
                    .
                    super__Vector_base<duckdb::PageInformation,_std::allocator<duckdb::PageInformation>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void erase_at(idx_t idx) { // NOLINT: not using camelcase on purpose here
		if (MemorySafety<SAFE>::ENABLED && idx > original::size()) {
			throw InternalException("Can't remove offset %d from vector of size %d", idx, original::size());
		}
		unsafe_erase_at(idx);
	}